

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<std::array<float,_4UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::array<float,4ul>>
          (optional<std::array<float,_4UL>_> *__return_storage_ptr__,PrimVar *this)

{
  optional<std::array<float,_4UL>_> local_2c;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<std::array<float,4ul>>(&local_2c,this);
  nonstd::optional_lite::optional<std::array<float,_4UL>_>::optional<std::array<float,_4UL>,_0>
            (__return_storage_ptr__,&local_2c);
  nonstd::optional_lite::optional<std::array<float,_4UL>_>::~optional(&local_2c);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }